

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsLinuxELFLinker.cxx
# Opt level: O0

bool __thiscall cmBinUtilsLinuxELFLinker::Prepare(cmBinUtilsLinuxELFLinker *this)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  ulong uVar4;
  ostream *poVar5;
  cmMakefile *this_00;
  pointer pcVar6;
  string local_3d8;
  undefined1 local_3b8 [8];
  ostringstream e_1;
  unique_ptr<cmLDConfigLDConfigTool,_std::default_delete<cmLDConfigLDConfigTool>_> local_240;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  string ldConfigTool;
  string local_1e8;
  undefined1 local_1c8 [8];
  ostringstream e;
  unique_ptr<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>_>
  local_50 [3];
  undefined1 local_38 [8];
  string tool;
  cmBinUtilsLinuxELFLinker *this_local;
  
  tool.field_2._8_8_ = this;
  psVar3 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  std::__cxx11::string::string((string *)local_38,(string *)psVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::__cxx11::string::operator=((string *)local_38,"objdump");
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"objdump");
  if (bVar1) {
    std::
    make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)local_50);
    std::
    unique_ptr<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>>
    ::operator=((unique_ptr<cmBinUtilsLinuxELFGetRuntimeDependenciesTool,std::default_delete<cmBinUtilsLinuxELFGetRuntimeDependenciesTool>>
                 *)&this->Tool,local_50);
    std::
    unique_ptr<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>_>
    ::~unique_ptr(local_50);
    this_00 = cmRuntimeDependencyArchive::GetMakefile((this->super_cmBinUtilsLinker).Archive);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"CMAKE_LDCONFIG_TOOL",&local_231);
    psVar3 = cmMakefile::GetSafeDefinition(this_00,&local_230);
    std::__cxx11::string::string((string *)local_210,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_210,"ldconfig");
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_210,"ldconfig");
    if (bVar1) {
      std::make_unique<cmLDConfigLDConfigTool,cmRuntimeDependencyArchive*&>
                ((cmRuntimeDependencyArchive **)&local_240);
      std::unique_ptr<cmLDConfigTool,std::default_delete<cmLDConfigTool>>::operator=
                ((unique_ptr<cmLDConfigTool,std::default_delete<cmLDConfigTool>> *)
                 &this->LDConfigTool,&local_240);
      std::unique_ptr<cmLDConfigLDConfigTool,_std::default_delete<cmLDConfigLDConfigTool>_>::
      ~unique_ptr(&local_240);
      pcVar6 = std::unique_ptr<cmLDConfigTool,_std::default_delete<cmLDConfigTool>_>::operator->
                         (&this->LDConfigTool);
      uVar2 = (*pcVar6->_vptr_cmLDConfigTool[2])(pcVar6,&this->LDConfigPaths);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
        ldConfigTool.field_2._12_4_ = 1;
      }
      else {
        this_local._7_1_ = true;
        ldConfigTool.field_2._12_4_ = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      poVar5 = std::operator<<((ostream *)local_3b8,"Invalid value for CMAKE_LDCONFIG_TOOL: ");
      std::operator<<(poVar5,(string *)local_210);
      std::__cxx11::ostringstream::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      this_local._7_1_ = false;
      ldConfigTool.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    }
    std::__cxx11::string::~string((string *)local_210);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    poVar5 = std::operator<<((ostream *)local_1c8,
                             "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ");
    std::operator<<(poVar5,(string *)local_38);
    std::__cxx11::ostringstream::str();
    cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    this_local._7_1_ = false;
    ldConfigTool.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  }
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsLinuxELFLinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    tool = "objdump";
  }
  if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsLinuxELFObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  std::string ldConfigTool =
    this->Archive->GetMakefile()->GetSafeDefinition("CMAKE_LDCONFIG_TOOL");
  if (ldConfigTool.empty()) {
    ldConfigTool = "ldconfig";
  }
  if (ldConfigTool == "ldconfig") {
    this->LDConfigTool =
      cm::make_unique<cmLDConfigLDConfigTool>(this->Archive);
    if (!this->LDConfigTool->GetLDConfigPaths(this->LDConfigPaths)) {
      return false;
    }
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_LDCONFIG_TOOL: " << ldConfigTool;
    this->SetError(e.str());
    return false;
  }

  return true;
}